

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect_storage.c
# Opt level: O2

log_aspect_interface log_aspect_storage_interface(void)

{
  return &log_aspect_storage_interface::aspect_interface_storage;
}

Assistant:

log_aspect_interface log_aspect_storage_interface(void)
{
	static struct log_aspect_storage_impl_type log_aspect_storage_impl_obj = {
		&log_aspect_storage_impl_append,
		&log_aspect_storage_impl_flush
	};

	static struct log_aspect_interface_type aspect_interface_storage = {
		&log_aspect_storage_create,
		&log_aspect_storage_impl_obj,
		&log_aspect_storage_destroy
	};

	return &aspect_interface_storage;
}